

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O2

void __thiscall nuraft::raft_server::handle_ext_resp_err(raft_server *this,rpc_exception *err)

{
  msg_type t_msg;
  int iVar1;
  element_type *peVar2;
  element_type *peVar3;
  bool bVar4;
  int iVar5;
  undefined8 uVar6;
  iterator iVar7;
  __shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2> *p_Var8;
  int iVar9;
  ptr<peer> p;
  int32 peer_id;
  ptr<req_msg> req;
  undefined1 local_b8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_b0;
  _Tuple_impl<1UL,_std::shared_ptr<nuraft::peer>,_std::shared_ptr<nuraft::req_msg>_> local_a8;
  undefined1 local_78 [16];
  __shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2> local_68;
  __shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2> local_58;
  raft_server *local_48;
  executor exec;
  
  std::__shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>,
             &(err->req_).super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>);
  peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar2 != (element_type *)0x0) {
    iVar5 = (**(code **)(*(long *)peVar2 + 0x38))();
    if (3 < iVar5) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      uVar6 = (**(code **)(*(long *)err + 0x10))(err);
      msg_if_given_abi_cxx11_
                ((string *)local_b8,"receive an rpc error response from peer server, %s %d",uVar6,
                 (ulong)((req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                         )->super_msg_base).type_);
      (**(code **)(*(long *)peVar2 + 0x40))
                (peVar2,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"handle_ext_resp_err",0x5b5,local_b8);
      std::__cxx11::string::~string((string *)local_b8);
    }
  }
  if (((((req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        super_msg_base).type_ == install_snapshot_request) &&
      (peVar3 = (this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr, peVar3 != (element_type *)0x0)) &&
     (((peVar3->config_).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->id_ == ((req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               super_msg_base).dst_)) {
    std::__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_58,
               &(this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>);
    bVar4 = check_snapshot_timeout(this,(ptr<peer> *)&local_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
    if (!bVar4) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar2 != (element_type *)0x0) {
        iVar5 = (**(code **)(*(long *)peVar2 + 0x38))();
        if (2 < iVar5) {
          peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_
                    ((string *)local_b8,
                     "sending snapshot to joining server %d failed, retry with temp heartbeat",
                     (ulong)(uint)((((this->srv_to_join_).
                                     super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_ptr)->config_).
                                   super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->id_);
          (**(code **)(*(long *)peVar2 + 0x40))
                    (peVar2,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                     ,"handle_ext_resp_err",0x5bd,local_b8);
          std::__cxx11::string::~string((string *)local_b8);
        }
      }
      LOCK();
      (this->srv_to_join_snp_retry_required_)._M_base._M_i = true;
      UNLOCK();
      enable_hb_for_peer(this,(this->srv_to_join_).
                              super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
  }
  t_msg = ((req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          super_msg_base).type_;
  if ((leave_cluster_request < t_msg) ||
     ((0x5400U >> (t_msg & (custom_notification_request|append_entries_request)) & 1) == 0))
  goto LAB_001ca1ce;
  p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peer_id = ((req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_msg_base).dst_;
  if (t_msg == leave_cluster_request) {
    iVar7 = std::
            _Hashtable<int,_std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->peers_)._M_h,&peer_id);
    if (iVar7.super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
        ._M_cur != (__node_type *)0x0) {
      p_Var8 = (__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)iVar7.
                      super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
                      ._M_cur + 0x10);
      goto LAB_001ca01d;
    }
  }
  else {
    p_Var8 = &(this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>;
LAB_001ca01d:
    std::__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>,p_Var8);
  }
  if (p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0)
  {
    iVar5 = ((p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            current_hb_interval_).super___atomic_base<int>._M_i;
    nuraft::context::get_params((context *)local_b8);
    iVar1 = *(int *)((long)local_b8 + 8);
    iVar9 = iVar1 / -2 + *(int *)((long)local_b8 + 4);
    if (iVar9 < iVar1) {
      iVar9 = iVar1;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_b0);
    if (iVar5 < iVar9) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar2 != (element_type *)0x0) {
        iVar5 = (**(code **)(*(long *)peVar2 + 0x38))();
        if (4 < iVar5) {
          peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_((string *)local_b8,"retry the request");
          (**(code **)(*(long *)peVar2 + 0x40))
                    (peVar2,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                     ,"handle_ext_resp_err",0x5dd,local_b8);
          std::__cxx11::string::~string((string *)local_b8);
        }
      }
      iVar5 = ((p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              current_hb_interval_).super___atomic_base<int>._M_i +
              (p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->rpc_backoff_;
      if ((p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->max_hb_interval_
          <= iVar5) {
        iVar5 = (p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                max_hb_interval_;
      }
      LOCK();
      ((p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->current_hb_interval_
      ).super___atomic_base<int>._M_i = iVar5;
      UNLOCK();
      local_78._0_8_ = on_retryable_req_err;
      local_78._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_48 = this;
      std::
      _Bind<void(nuraft::raft_server::*(nuraft::raft_server*,std::shared_ptr<nuraft::peer>,std::shared_ptr<nuraft::req_msg>))(std::shared_ptr<nuraft::peer>&,std::shared_ptr<nuraft::req_msg>&)>
      ::_Bind<nuraft::raft_server*,std::shared_ptr<nuraft::peer>&,std::shared_ptr<nuraft::req_msg>&>
                ((_Bind<void(nuraft::raft_server::*(nuraft::raft_server*,std::shared_ptr<nuraft::peer>,std::shared_ptr<nuraft::req_msg>))(std::shared_ptr<nuraft::peer>&,std::shared_ptr<nuraft::req_msg>&)>
                  *)local_b8,(offset_in_raft_server_to_subr *)local_78,&local_48,&p,&req);
      std::function<void()>::
      function<std::_Bind<void(nuraft::raft_server::*(nuraft::raft_server*,std::shared_ptr<nuraft::peer>,std::shared_ptr<nuraft::req_msg>))(std::shared_ptr<nuraft::peer>&,std::shared_ptr<nuraft::req_msg>&)>,void>
                ((function<void()> *)&exec,
                 (_Bind<void_(nuraft::raft_server::*(nuraft::raft_server_*,_std::shared_ptr<nuraft::peer>,_std::shared_ptr<nuraft::req_msg>))(std::shared_ptr<nuraft::peer>_&,_std::shared_ptr<nuraft::req_msg>_&)>
                  *)local_b8);
      std::_Tuple_impl<1UL,_std::shared_ptr<nuraft::peer>,_std::shared_ptr<nuraft::req_msg>_>::
      ~_Tuple_impl(&local_a8);
      std::make_shared<nuraft::timer_task<void>,std::function<void()>&>
                ((function<void_()> *)local_78);
      local_b8 = (undefined1  [8])local_78._0_8_;
      _Stack_b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_;
      local_78._0_8_ = (void *)0x0;
      local_78._8_8_ = 0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
      schedule_task(this,(ptr<delayed_task> *)local_b8,
                    ((p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    current_hb_interval_).super___atomic_base<int>._M_i);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_b0);
      std::_Function_base::~_Function_base(&exec.super__Function_base);
    }
    else {
      std::__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_68,&p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>);
      handle_join_leave_rpc_err(this,t_msg,(ptr<peer> *)&local_68);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
LAB_001ca1ce:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void raft_server::handle_ext_resp_err(rpc_exception& err) {
    ptr<req_msg> req = err.req();
    p_in( "receive an rpc error response from peer server, %s %d",
          err.what(), req->get_type() );

    if ( req->get_type() == msg_type::install_snapshot_request ) {
        if (srv_to_join_ && srv_to_join_->get_id() == req->get_dst()) {
            bool timed_out = check_snapshot_timeout(srv_to_join_);
            if (!timed_out) {
                // Enable temp HB to retry snapshot.
                p_wn("sending snapshot to joining server %d failed, "
                     "retry with temp heartbeat", srv_to_join_->get_id());
                srv_to_join_snp_retry_required_ = true;
                enable_hb_for_peer(*srv_to_join_);
            }
        }
    }

    if ( req->get_type() != msg_type::sync_log_request     &&
         req->get_type() != msg_type::join_cluster_request &&
         req->get_type() != msg_type::leave_cluster_request ) {
        return;
    }

    ptr<peer> p;
    msg_type t_msg = req->get_type();
    int32 peer_id = req->get_dst();
    if (t_msg == msg_type::leave_cluster_request) {
        peer_itor pit = peers_.find(peer_id);
        if (pit != peers_.end()) {
            p = pit->second;
        }
    } else {
        p = srv_to_join_;
    }
    if (!p) return;

    if (p->get_current_hb_interval() >= ctx_->get_params()->max_hb_interval()) {
        handle_join_leave_rpc_err(t_msg, p);

    } else {
        // reuse the heartbeat interval value to indicate
        // when to stop retrying, as rpc backoff is the same.
        p_db("retry the request");
        p->slow_down_hb();
        timer_task<void>::executor exec =
            (timer_task<void>::executor)
            std::bind( &raft_server::on_retryable_req_err, this, p, req );
        ptr<delayed_task> task(cs_new<timer_task<void>>(exec));
        schedule_task(task, p->get_current_hb_interval());
    }
}